

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

int lua_resume(lua_State *L,lua_State *from,int nargs)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  int iVar3;
  bool bVar4;
  int local_28;
  int iStack_24;
  unsigned_short oldnny;
  int status;
  int nargs_local;
  lua_State *from_local;
  lua_State *L_local;
  
  uVar1 = L->nny;
  iStack_24 = nargs;
  _status = from;
  from_local = L;
  if (L->status == '\0') {
    if (L->ci != &L->base_ci) {
      iVar3 = resume_error(L,"cannot resume non-suspended coroutine",nargs);
      return iVar3;
    }
  }
  else if (L->status != '\x01') {
    iVar3 = resume_error(L,"cannot resume dead coroutine",nargs);
    return iVar3;
  }
  if (from == (lua_State *)0x0) {
    uVar2 = 1;
  }
  else {
    uVar2 = from->nCcalls + 1;
  }
  L->nCcalls = uVar2;
  if (L->nCcalls < 200) {
    L->nny = 0;
    local_28 = luaD_rawrunprotected(L,resume,&stack0xffffffffffffffdc);
    if (local_28 == -1) {
      local_28 = 2;
    }
    else {
      while( true ) {
        bVar4 = false;
        if (1 < local_28) {
          iVar3 = recover(from_local,local_28);
          bVar4 = iVar3 != 0;
        }
        if (!bVar4) break;
        local_28 = luaD_rawrunprotected(from_local,unroll,&local_28);
      }
      if (1 < local_28) {
        from_local->status = (lu_byte)local_28;
        seterrorobj(from_local,local_28,from_local->top);
        from_local->ci->top = from_local->top;
      }
    }
    from_local->nny = uVar1;
    from_local->nCcalls = from_local->nCcalls - 1;
    L_local._4_4_ = local_28;
  }
  else {
    L_local._4_4_ = resume_error(L,"C stack overflow",nargs);
  }
  return L_local._4_4_;
}

Assistant:

LUA_API int lua_resume(lua_State *L, lua_State *from, int nargs) {
    int status;
    unsigned short oldnny = L->nny;  /* save "number of non-yieldable" calls */
    lua_lock(L);
    if (L->status == LUA_OK) {  /* may be starting a coroutine */
        if (L->ci != &L->base_ci)  /* not in base level? */
            return resume_error(L, "cannot resume non-suspended coroutine", nargs);
    } else if (L->status != LUA_YIELD)
        return resume_error(L, "cannot resume dead coroutine", nargs);
    L->nCcalls = (from) ? from->nCcalls + 1 : 1;
    if (L->nCcalls >= LUAI_MAXCCALLS)
        return resume_error(L, "C stack overflow", nargs);
    luai_userstateresume(L, nargs);
    L->nny = 0;  /* allow yields */
    api_checknelems(L, (L->status == LUA_OK) ? nargs + 1 : nargs);
    status = luaD_rawrunprotected(L, resume, &nargs);
    if (status == -1)  /* error calling 'lua_resume'? */
        status = LUA_ERRRUN;
    else {  /* continue running after recoverable errors */
        while (errorstatus(status) && recover(L, status)) {
            /* unroll continuation */
            status = luaD_rawrunprotected(L, unroll, &status);
        }
        if (errorstatus(status)) {  /* unrecoverable error? */
            L->status = cast_byte(status);  /* mark thread as 'dead' */
            seterrorobj(L, status, L->top);  /* push error message */
            L->ci->top = L->top;
        } else
            lua_assert(status == L->status);  /* normal end or yield */
    }
    L->nny = oldnny;  /* restore 'nny' */
    L->nCcalls--;
    lua_assert(L->nCcalls == ((from) ? from->nCcalls : 0));
    lua_unlock(L);
    return status;
}